

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O2

uint MurmurHash3(uint nHashSeed,Span<const_unsigned_char> vDataToHash)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uchar *puVar6;
  ulong uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  
  puVar6 = vDataToHash.m_data;
  uVar2 = vDataToHash.m_size >> 2;
  uVar5 = 0;
  iVar1 = (int)uVar2;
  uVar7 = 0;
  if (0 < iVar1) {
    uVar7 = uVar2 & 0xffffffff;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    uVar8 = (*(int *)(puVar6 + uVar5 * 4) * 0x16a88000 |
            (uint)(*(int *)(puVar6 + uVar5 * 4) * -0x3361d2af) >> 0x11) * 0x1b873593 ^ nHashSeed;
    nHashSeed = (uVar8 << 0xd | uVar8 >> 0x13) * 5 + 0xe6546b64;
  }
  lVar3 = (long)iVar1;
  uVar4 = 0;
  uVar8 = 0;
  switch((uint)vDataToHash.m_size & 3) {
  case 3:
    uVar8 = (uint)puVar6[lVar3 * 4 + 2] << 0x10;
  case 2:
    uVar4 = uVar8 | (uint)puVar6[lVar3 * 4 + 1] << 8;
  case 1:
    nHashSeed = nHashSeed ^
                ((puVar6[lVar3 * 4] ^ uVar4) * 0x16a88000 |
                (puVar6[lVar3 * 4] ^ uVar4) * -0x3361d2af >> 0x11) * 0x1b873593;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    uVar8 = nHashSeed ^ (uint)vDataToHash.m_size;
    uVar8 = (uVar8 >> 0x10 ^ uVar8) * -0x7a143595;
    uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
    return uVar8 >> 0x10 ^ uVar8;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int MurmurHash3(unsigned int nHashSeed, Span<const unsigned char> vDataToHash)
{
    // The following is MurmurHash3 (x86_32), see https://github.com/aappleby/smhasher/blob/master/src/MurmurHash3.cpp
    uint32_t h1 = nHashSeed;
    const uint32_t c1 = 0xcc9e2d51;
    const uint32_t c2 = 0x1b873593;

    const int nblocks = vDataToHash.size() / 4;

    //----------
    // body
    const uint8_t* blocks = vDataToHash.data();

    for (int i = 0; i < nblocks; ++i) {
        uint32_t k1 = ReadLE32(blocks + i*4);

        k1 *= c1;
        k1 = std::rotl(k1, 15);
        k1 *= c2;

        h1 ^= k1;
        h1 = std::rotl(h1, 13);
        h1 = h1 * 5 + 0xe6546b64;
    }

    //----------
    // tail
    const uint8_t* tail = vDataToHash.data() + nblocks * 4;

    uint32_t k1 = 0;

    switch (vDataToHash.size() & 3) {
        case 3:
            k1 ^= tail[2] << 16;
            [[fallthrough]];
        case 2:
            k1 ^= tail[1] << 8;
            [[fallthrough]];
        case 1:
            k1 ^= tail[0];
            k1 *= c1;
            k1 = std::rotl(k1, 15);
            k1 *= c2;
            h1 ^= k1;
    }

    //----------
    // finalization
    h1 ^= vDataToHash.size();
    h1 ^= h1 >> 16;
    h1 *= 0x85ebca6b;
    h1 ^= h1 >> 13;
    h1 *= 0xc2b2ae35;
    h1 ^= h1 >> 16;

    return h1;
}